

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_aver_s_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3 = *(undefined1 (*) [16])&(env->active_fpu).fpr[ws].fd;
  auVar2 = *(undefined1 (*) [16])&(env->active_fpu).fpr[wt].fd;
  auVar4._0_2_ = auVar3._0_2_ >> 1;
  auVar4._2_2_ = auVar3._2_2_ >> 1;
  auVar4._4_2_ = auVar3._4_2_ >> 1;
  auVar4._6_2_ = auVar3._6_2_ >> 1;
  auVar4._8_2_ = auVar3._8_2_ >> 1;
  auVar4._10_2_ = auVar3._10_2_ >> 1;
  auVar4._12_2_ = auVar3._12_2_ >> 1;
  auVar4._14_2_ = auVar3._14_2_ >> 1;
  auVar4 = auVar4 & _DAT_00b90350 ^ _DAT_00b90360;
  auVar5._0_2_ = auVar2._0_2_ >> 1;
  auVar5._2_2_ = auVar2._2_2_ >> 1;
  auVar5._4_2_ = auVar2._4_2_ >> 1;
  auVar5._6_2_ = auVar2._6_2_ >> 1;
  auVar5._8_2_ = auVar2._8_2_ >> 1;
  auVar5._10_2_ = auVar2._10_2_ >> 1;
  auVar5._12_2_ = auVar2._12_2_ >> 1;
  auVar5._14_2_ = auVar2._14_2_ >> 1;
  auVar5 = auVar5 & _DAT_00b90350 ^ _DAT_00b90360;
  auVar3 = (auVar2 | auVar3) & _DAT_00b90370;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(char *)pfVar1 = auVar3[0] + auVar5[0] + auVar4[0] + -0x80;
  *(char *)((long)pfVar1 + 1) = auVar3[1] + auVar5[1] + auVar4[1] + -0x80;
  *(char *)((long)pfVar1 + 2) = auVar3[2] + auVar5[2] + auVar4[2] + -0x80;
  *(char *)((long)pfVar1 + 3) = auVar3[3] + auVar5[3] + auVar4[3] + -0x80;
  *(char *)((long)pfVar1 + 4) = auVar3[4] + auVar5[4] + auVar4[4] + -0x80;
  *(char *)((long)pfVar1 + 5) = auVar3[5] + auVar5[5] + auVar4[5] + -0x80;
  *(char *)((long)pfVar1 + 6) = auVar3[6] + auVar5[6] + auVar4[6] + -0x80;
  *(char *)((long)pfVar1 + 7) = auVar3[7] + auVar5[7] + auVar4[7] + -0x80;
  *(char *)((long)pfVar1 + 8) = auVar3[8] + auVar5[8] + auVar4[8] + -0x80;
  *(char *)((long)pfVar1 + 9) = auVar3[9] + auVar5[9] + auVar4[9] + -0x80;
  *(char *)((long)pfVar1 + 10) = auVar3[10] + auVar5[10] + auVar4[10] + -0x80;
  *(char *)((long)pfVar1 + 0xb) = auVar3[0xb] + auVar5[0xb] + auVar4[0xb] + -0x80;
  *(char *)((long)pfVar1 + 0xc) = auVar3[0xc] + auVar5[0xc] + auVar4[0xc] + -0x80;
  *(char *)((long)pfVar1 + 0xd) = auVar3[0xd] + auVar5[0xd] + auVar4[0xd] + -0x80;
  *(char *)((long)pfVar1 + 0xe) = auVar3[0xe] + auVar5[0xe] + auVar4[0xe] + -0x80;
  *(char *)((long)pfVar1 + 0xf) = auVar3[0xf] + auVar5[0xf] + auVar4[0xf] + -0x80;
  return;
}

Assistant:

void helper_msa_aver_s_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_aver_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_aver_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_aver_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_aver_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_aver_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_aver_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_aver_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_aver_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_aver_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_aver_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_aver_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_aver_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_aver_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_aver_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_aver_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_aver_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}